

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluatePreModify(ExpressionEvalContext *ctx,ExprPreModify *expression)

{
  SynBase *source;
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  ExprBase *pEVar4;
  ExprIntegerLiteral *this;
  SynBinaryOpType op;
  ExprBase *modified;
  ExprBase *value;
  ExprBase *ptr;
  ExprPreModify *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar2)->targetYield != 0)) {
    pEVar3 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar3,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return pEVar3;
  }
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    pEVar3 = Evaluate(ctx,expression->value);
    if (pEVar3 == (ExprBase *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      pEVar4 = CreateLoad(ctx,pEVar3);
      if (pEVar4 == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        source = (expression->super_ExprBase).source;
        this = ExpressionContext::get<ExprIntegerLiteral>(ctx->ctx);
        ExprIntegerLiteral::ExprIntegerLiteral
                  (this,(expression->super_ExprBase).source,pEVar4->type,1);
        op = SYN_BINARY_OP_SUB;
        if ((expression->isIncrement & 1U) != 0) {
          op = SYN_BINARY_OP_ADD;
        }
        pEVar4 = CreateBinaryOp(ctx,source,pEVar4,&this->super_ExprBase,op);
        if (pEVar4 == (ExprBase *)0x0) {
          ctx_local = (ExpressionEvalContext *)0x0;
        }
        else {
          bVar1 = CreateStore(ctx,pEVar3,pEVar4);
          if (bVar1) {
            ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEVar4);
          }
          else {
            ctx_local = (ExpressionEvalContext *)0x0;
          }
        }
      }
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluatePreModify(ExpressionEvalContext &ctx, ExprPreModify *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *ptr = Evaluate(ctx, expression->value);

	if(!ptr)
		return NULL;

	ExprBase *value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	ExprBase *modified = CreateBinaryOp(ctx, expression->source, value, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, value->type, 1), expression->isIncrement ? SYN_BINARY_OP_ADD : SYN_BINARY_OP_SUB);

	if(!modified)
		return NULL;

	if(!CreateStore(ctx, ptr, modified))
		return NULL;

	return CheckType(expression, modified);
}